

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z80.cpp
# Opt level: O2

void __thiscall Z80::OpCode_EX(Z80 *this)

{
  bool bVar1;
  Z80Reg ZVar2;
  EBracketType EVar3;
  int iVar4;
  Z80Reg ZVar5;
  Z80Reg ZVar6;
  uint uVar7;
  Z80Reg ZVar8;
  char **ppcVar9;
  Z80Reg ZVar10;
  Z80Reg local_38 [6];
  
  local_38[0] = Z80_UNK;
  local_38[1] = 0xffffffff;
  local_38[2] = 0xffffffff;
  local_38[3] = 0xffffffff;
  ZVar8 = Z80_UNK;
  ZVar2 = GetRegister((char **)this);
  ZVar10 = ZVar8;
  if ((ZVar2 != Z80_SP) && (ZVar10 = ZVar2, ZVar2 == Z80_UNK)) {
    ppcVar9 = &lp;
    EVar3 = OpenBracket(&lp);
    ZVar10 = ZVar8;
    if ((EVar3 != BT_NONE) && (ZVar2 = GetRegister(ppcVar9), ZVar2 == Z80_SP)) {
      iVar4 = CloseBracket(&lp);
      ZVar10 = -(uint)(iVar4 == 0) | Z80_SP;
    }
  }
  ppcVar9 = &lp;
  bVar1 = comma(&lp);
  ZVar2 = ZVar10;
  ZVar5 = ZVar8;
  if (bVar1) {
    ZVar5 = GetRegister(ppcVar9);
    if (ZVar5 == Z80_UNK) {
      ppcVar9 = &lp;
      EVar3 = OpenBracket(&lp);
      ZVar5 = ZVar8;
      if ((EVar3 != BT_NONE) && (ZVar6 = GetRegister(ppcVar9), ZVar6 == Z80_SP)) {
        iVar4 = CloseBracket(&lp);
        ZVar5 = -(uint)(iVar4 == 0) | ZVar10;
        ZVar2 = Z80_SP;
        if (iVar4 == 0) {
          ZVar2 = ZVar10;
        }
      }
    }
    else if ((ZVar5 == Z80_AF) && (ZVar5 = Z80_AF, *lp == '\'')) {
      lp = lp + 1;
    }
  }
  uVar7 = ZVar2 << 0x1c | (uint)(ZVar2 + ~(Z80_BC|Z80_I|Z80_A)) >> 4;
  if (uVar7 < 2) {
    if (bVar1) {
      if ((ZVar2 ^ ZVar5) == Z80_BC) {
        local_38[0] = 0xeb;
      }
      goto LAB_001316e6;
    }
  }
  else {
    if (uVar7 != 2) {
      if (((uVar7 == 3) && (!bVar1 || ZVar5 == Z80_AF)) && (Options::IsI8080 == '\0')) {
        local_38[0] = Z80_I;
      }
      goto LAB_001316e6;
    }
    if (bVar1) {
      if ((ZVar5 == Z80_IY) || (ZVar5 == Z80_IX)) {
        local_38[1] = 0xe3;
        local_38[0] = ZVar5;
      }
      else if (ZVar5 == Z80_HL) {
        local_38[0] = 0xe3;
      }
      goto LAB_001316e6;
    }
  }
  Error("[EX] Comma expected",(char *)0x0,PASS3);
LAB_001316e6:
  EmitBytes(local_38,true);
  return;
}

Assistant:

static void OpCode_EX() {
		int e[] { -1, -1, -1, -1 };
		// parse first and optional second register, swap them for "(sp)" to have sp always first
		Z80Reg reg1 = GetRegister(lp), reg2 = Z80_UNK;
		if (Z80_SP == reg1) {
			reg1 = Z80_UNK;		// naked SP should not work, must be in brackets
		} else if (Z80_UNK == reg1 && BT_NONE != OpenBracket(lp) && Z80_SP == GetRegister(lp) && CloseBracket(lp)) {
			reg1 = Z80_SP;						// using SP register constant for MEM_SP situation
		}
		bool has_comma = comma(lp);
		if (has_comma) {
			reg2 = GetRegister(lp);
			if (Z80_AF == reg2 && *lp == '\'') ++lp;
			if (Z80_UNK == reg2 && BT_NONE != OpenBracket(lp) && Z80_SP == GetRegister(lp) && CloseBracket(lp)) {
				// "(sp)" at right side, swap it with reg1 (official Zilog syntax)
				reg2 = reg1;
				reg1 = Z80_SP;					// using SP register constant for MEM_SP situation
			}
		}
		switch (reg1) {
		case Z80_AF:
			if (Options::IsI8080) break;
			if (has_comma && Z80_AF != reg2) break;
			e[0] = 0x08;
			break;
		case Z80_DE:
		case Z80_HL:
			if (!has_comma) {
				Error("[EX] Comma expected");
				break;
			}
			if (Z80Reg(reg1 ^ Z80_DE ^ Z80_HL) != reg2) break;	// check for the other one: DE <-> HL
			e[0] = 0xeb;
			break;
		case Z80_SP:
			if (!has_comma) {
				Error("[EX] Comma expected");
				break;
			}
			switch (reg2) {
			case Z80_HL:
				e[0] = 0xe3; break;
			case Z80_IX:
			case Z80_IY:
				e[0] = reg2; e[1] = 0xe3; break;
			default:
				break;
			}
			break;
		default:
			break;
		}
		EmitBytes(e, true);
	}